

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O3

byte * __thiscall
Js::ByteCodeBufferReader::DeserializeVarArray<Js::VarArrayVarCount>
          (ByteCodeBufferReader *this,ScriptContext *scriptContext,byte *buffer,
          ByteBlock *deserializeInto)

{
  uint uVar1;
  code *pcVar2;
  double value_00;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  undefined4 *puVar6;
  byte *pbVar7;
  size_t sVar8;
  uint64 uVar9;
  uint64 uVar10;
  VarArrayVarCount *this_00;
  ulong uVar11;
  undefined8 local_40;
  int8 value;
  byte local_31 [8];
  byte code;
  
  uVar1 = *(uint *)buffer;
  uVar4 = ByteBlock::GetLength(deserializeInto);
  if ((ulong)uVar4 <= (ulong)uVar1 + 8) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x1261,
                                "(serialized->offset + sizeof(T) < deserializeInto->GetLength())",
                                "serialized->offset + sizeof(T) < deserializeInto->GetLength()");
    if (!bVar3) goto LAB_0088833f;
    *puVar6 = 0;
  }
  pbVar7 = ByteBlock::GetBuffer(deserializeInto);
  uVar1 = *(uint *)(buffer + 5);
  this_00 = (VarArrayVarCount *)(pbVar7 + *(uint *)buffer);
  VarArrayVarCount::SetCount(this_00,uVar1);
  uVar5 = *(uint *)buffer;
  sVar8 = VarArrayVarCount::GetDataSize(this_00);
  uVar4 = ByteBlock::GetLength(deserializeInto);
  if ((ulong)uVar4 < sVar8 + uVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x1265,
                                "(serialized->offset + result->GetDataSize() <= deserializeInto->GetLength())"
                                ,
                                "serialized->offset + result->GetDataSize() <= deserializeInto->GetLength()"
                               );
    if (!bVar3) {
LAB_0088833f:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  pbVar7 = buffer + 9;
  if ((ulong)uVar1 != 0) {
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    uVar11 = 0;
    do {
      pbVar7 = ReadByte(pbVar7,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar7)),local_31
                       );
      switch(local_31[0]) {
      case 1:
        pbVar7 = ReadByte(pbVar7,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar7)),
                          (byte *)&local_40);
        uVar5 = (uint)(char)(byte)local_40;
        break;
      case 2:
        pbVar7 = ReadConstantSizedInt16
                           (pbVar7,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar7)),
                            (int16 *)&local_40);
        uVar5 = (uint)CONCAT11(local_40._1_1_,(byte)local_40);
        break;
      case 3:
        pbVar7 = ReadConstantSizedInt32
                           (pbVar7,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar7)),
                            (int *)&local_40);
        uVar5 = CONCAT22(local_40._2_2_,CONCAT11(local_40._1_1_,(byte)local_40));
        break;
      case 4:
        pbVar7 = ReadDouble(pbVar7,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar7)),
                            (double *)&local_40);
        value_00 = (double)CONCAT44(local_40._4_4_,
                                    CONCAT22(local_40._2_2_,CONCAT11(local_40._1_1_,(byte)local_40))
                                   );
        uVar9 = NumberUtilities::ToSpecial(value_00);
        bVar3 = NumberUtilities::IsNan(value_00);
        if (((bVar3) &&
            (uVar10 = NumberUtilities::ToSpecial(value_00), uVar10 != 0xfff8000000000000)) &&
           (uVar10 = NumberUtilities::ToSpecial(value_00), uVar10 != 0x7ff8000000000000)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar6 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                      ,0xa2,
                                      "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                      ,"We should only produce a NaN with this value");
          if (!bVar3) goto LAB_0088833f;
          *puVar6 = 0;
        }
        this_00[uVar11 + 1].count = (Var)(uVar9 ^ 0xfffc000000000000);
        goto LAB_008882d2;
      default:
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                    ,0x1291,"((0))","Unexpected object type in VarArray");
        if (bVar3) {
          *puVar6 = 0;
          Throw::FatalInternalError(-0x7fffbffb);
        }
        goto LAB_0088833f;
      }
      this_00[uVar11 + 1].count = (Var)((ulong)uVar5 | 0x1000000000000);
LAB_008882d2:
      uVar11 = uVar11 + 1;
    } while (uVar1 != uVar11);
  }
  return pbVar7;
}

Assistant:

const byte * DeserializeVarArray(ScriptContext * scriptContext, const byte * buffer, ByteBlock * deserializeInto)
    {
        auto serialized = (serialization_alignment const Js::SerializedVarArray *)buffer;
#ifdef BYTE_CODE_MAGIC_CONSTANTS
        Assert(serialized->magic == magicStartOfAuxVarArray);
#endif
        Assert(serialized->offset + sizeof(T) < deserializeInto->GetLength());
        auto result = (T *)(deserializeInto->GetBuffer() + serialized->offset);
        uint count = serialized->varCount;
        result->SetCount(count);
        Assert(serialized->offset + result->GetDataSize() <= deserializeInto->GetLength());

        auto content = (const byte*)(serialized + 1);
        auto current = content;
        for (uint index = 0; index < count; index++)
        {
            byte code;
            current = ReadByte(current, &code);
            switch(code)
            {
                case ctInt32:
                    {
                        int value;
                        current = ReadConstantSizedInt32(current, &value);
                        result->elements[index] = Js::TaggedInt::ToVarUnchecked(value);
                        break;
                    }
                case ctInt16:
                    {
                        int16 value;
                        current = ReadConstantSizedInt16(current, &value);
                        result->elements[index] = Js::TaggedInt::ToVarUnchecked(value);
                        break;
                    }
                case ctInt8:
                    {
                        int8 value;
                        current = ReadByte(current, (byte *)&value);
                        result->elements[index] = Js::TaggedInt::ToVarUnchecked(value);
                        break;
                    }
                case ctNumber:
                    {
                        double value;
                        current = ReadDouble(current, &value);
                        const auto number = Js::JavascriptNumber::New(value, scriptContext);
#if !FLOATVAR
                        scriptContext->BindReference(number);
#endif
                        result->elements[index] = number;
                        break;
                    }

                default:
                    AssertMsg(UNREACHED, "Unexpected object type in VarArray");
                    Throw::FatalInternalError();
            }
        }

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        int magicEnd;
        current = ReadInt32(current, &magicEnd);
        Assert(magicEnd == magicEndOfAuxVarArray);
#endif
        return current;
    }